

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_schedule_plugin(_func_void *newplugin,int cycle,int shift)

{
  char cVar1;
  int iVar2;
  int local_20;
  int abs_cycle;
  int shift_local;
  int cycle_local;
  _func_void *newplugin_local;
  
  cVar1 = fsnav_add_plugin(newplugin);
  if (cVar1 == '\0') {
    newplugin_local._7_1_ = '\0';
  }
  else {
    iVar2 = cycle;
    if (cycle < 1) {
      iVar2 = -cycle;
    }
    local_20 = shift;
    if (iVar2 == 0) {
      local_20 = 0;
    }
    else {
      for (; iVar2 <= local_20; local_20 = local_20 - iVar2) {
      }
      for (; local_20 < 0; local_20 = iVar2 + local_20) {
      }
    }
    (fsnav->core).plugins[(fsnav->core).plugin_count - 1].cycle = cycle;
    (fsnav->core).plugins[(fsnav->core).plugin_count - 1].shift = local_20;
    (fsnav->core).plugins[(fsnav->core).plugin_count - 1].tick = 0;
    newplugin_local._7_1_ = '\x01';
  }
  return newplugin_local._7_1_;
}

Assistant:

char fsnav_schedule_plugin(void(*newplugin)(void), int cycle, int shift)
{
	int abs_cycle;

	// add to the execution list
	if (!fsnav_add_plugin(newplugin))
		return 0;
	// shrink shift to [0..cycle-1]
	abs_cycle = abs(cycle);
	if (abs_cycle) {
		while (shift >= abs_cycle)
			shift -= abs_cycle;
		while (shift < 0)
			shift += abs_cycle;
	}
	else
		shift = 0;
	// set scheduling parameters
	fsnav->core.plugins[fsnav->core.plugin_count-1].cycle = cycle;
	fsnav->core.plugins[fsnav->core.plugin_count-1].shift = shift;
	fsnav->core.plugins[fsnav->core.plugin_count-1].tick  = 0;

	return 1;
}